

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int skip_repeated_mv(AV1_COMMON *cm,MACROBLOCK *x,PREDICTION_MODE this_mode,
                    MV_REFERENCE_FRAME *ref_frames,InterModeSearchState *search_state)

{
  byte bVar1;
  int16_t iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int this_cost;
  int compare_cost;
  int16_t mode_ctx;
  PREDICTION_MODE compare_mode;
  int ref_mv_count;
  MB_MODE_INFO_EXT *mbmi_ext;
  uint8_t ref_frame_type;
  int is_comp_pred;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffba;
  byte bVar7;
  undefined4 in_stack_ffffffffffffffc8;
  
  uVar3 = (uint)('\0' < in_RCX[1]);
  bVar1 = av1_ref_frame_type(in_stack_ffffffffffffffa8);
  uVar4 = (uint)*(byte *)(in_RSI + 0x40f8 + (ulong)bVar1);
  bVar7 = 0x19;
  if (uVar3 == 0) {
    if (in_DL == 0xe) {
      if (uVar4 == 0) {
        bVar7 = 0xd;
      }
      if ((uVar4 == 1) && (*(byte *)(in_RDI + (long)*in_RCX * 0x24 + 0x5f84) < 2)) {
        bVar7 = 0xf;
      }
    }
    if (in_DL == 0xf) {
      if ((uVar4 == 0) && (*(byte *)(in_RDI + (long)*in_RCX * 0x24 + 0x5f84) < 2)) {
        bVar7 = 0xd;
      }
      if (uVar4 == 1) {
        bVar7 = 0xe;
      }
    }
    if ((bVar7 != 0x19) &&
       (*(long *)(in_R8 + 2000 + (ulong)bVar7 * 0xc0 + (long)*in_RCX * 8) != 0x7fffffffffffffff)) {
      iVar2 = av1_mode_context_analyzer
                        ((int16_t *)(ulong)CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc8),
                         (MV_REFERENCE_FRAME *)(in_RSI + 0x3c70));
      iVar5 = cost_mv_ref((ModeCosts *)
                          CONCAT44(uVar4,CONCAT13(bVar7,CONCAT12(in_stack_ffffffffffffffba,iVar2))),
                          (PREDICTION_MODE)((uint)in_stack_ffffffffffffffb4 >> 0x18),
                          (int16_t)in_stack_ffffffffffffffb4);
      iVar6 = cost_mv_ref((ModeCosts *)
                          CONCAT44(uVar4,CONCAT13(bVar7,CONCAT12(in_stack_ffffffffffffffba,iVar2))),
                          (PREDICTION_MODE)((uint)iVar5 >> 0x18),(int16_t)iVar5);
      if (iVar5 < iVar6) {
        *(undefined8 *)(in_R8 + 2000 + (ulong)in_DL * 0xc0 + (long)*in_RCX * 8) =
             *(undefined8 *)(in_R8 + 2000 + (ulong)bVar7 * 0xc0 + (long)*in_RCX * 8);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int skip_repeated_mv(const AV1_COMMON *const cm,
                            const MACROBLOCK *const x,
                            PREDICTION_MODE this_mode,
                            const MV_REFERENCE_FRAME ref_frames[2],
                            InterModeSearchState *search_state) {
  const int is_comp_pred = ref_frames[1] > INTRA_FRAME;
  const uint8_t ref_frame_type = av1_ref_frame_type(ref_frames);
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const int ref_mv_count = mbmi_ext->ref_mv_count[ref_frame_type];
  PREDICTION_MODE compare_mode = MB_MODE_COUNT;
  if (!is_comp_pred) {
    if (this_mode == NEARMV) {
      if (ref_mv_count == 0) {
        // NEARMV has the same motion vector as NEARESTMV
        compare_mode = NEARESTMV;
      }
      if (ref_mv_count == 1 &&
          cm->global_motion[ref_frames[0]].wmtype <= TRANSLATION) {
        // NEARMV has the same motion vector as GLOBALMV
        compare_mode = GLOBALMV;
      }
    }
    if (this_mode == GLOBALMV) {
      if (ref_mv_count == 0 &&
          cm->global_motion[ref_frames[0]].wmtype <= TRANSLATION) {
        // GLOBALMV has the same motion vector as NEARESTMV
        compare_mode = NEARESTMV;
      }
      if (ref_mv_count == 1) {
        // GLOBALMV has the same motion vector as NEARMV
        compare_mode = NEARMV;
      }
    }

    if (compare_mode != MB_MODE_COUNT) {
      // Use modelled_rd to check whether compare mode was searched
      if (search_state->modelled_rd[compare_mode][0][ref_frames[0]] !=
          INT64_MAX) {
        const int16_t mode_ctx =
            av1_mode_context_analyzer(mbmi_ext->mode_context, ref_frames);
        const int compare_cost =
            cost_mv_ref(&x->mode_costs, compare_mode, mode_ctx);
        const int this_cost = cost_mv_ref(&x->mode_costs, this_mode, mode_ctx);

        // Only skip if the mode cost is larger than compare mode cost
        if (this_cost > compare_cost) {
          search_state->modelled_rd[this_mode][0][ref_frames[0]] =
              search_state->modelled_rd[compare_mode][0][ref_frames[0]];
          return 1;
        }
      }
    }
  }
  return 0;
}